

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::RepeatedMessage::GeneratePrivateMembers
          (RepeatedMessage *this,Printer *p)

{
  if ((this->super_FieldGeneratorBase).should_split_ == true) {
    io::Printer::Emit(p,0x4a,
                      "\n      $pbi$::RawPtr<$pb$::$Weak$RepeatedPtrField<$Submsg$>> $name$_;\n    "
                     );
    return;
  }
  io::Printer::Emit(p,0x32,"$pb$::$Weak$RepeatedPtrField< $Submsg$ > $name$_;\n");
  return;
}

Assistant:

void RepeatedMessage::GeneratePrivateMembers(io::Printer* p) const {
  if (should_split()) {
    p->Emit(R"cc(
      $pbi$::RawPtr<$pb$::$Weak$RepeatedPtrField<$Submsg$>> $name$_;
    )cc");
  } else {
    p->Emit("$pb$::$Weak$RepeatedPtrField< $Submsg$ > $name$_;\n");
  }
}